

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_info.cpp
# Opt level: O3

ostream * CMU462::Collada::operator<<(ostream *os,CameraInfo *camera)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"CameraInfo: ",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(camera->super_Instance).name._M_dataplus._M_p,
                      (camera->super_Instance).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (id: ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(camera->super_Instance).id._M_dataplus._M_p,
                      (camera->super_Instance).id._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," hfov=",6);
  poVar1 = std::ostream::_M_insert<double>((double)camera->hFov);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," vfov=",6);
  poVar1 = std::ostream::_M_insert<double>((double)camera->vFov);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," nclip=",7);
  poVar1 = std::ostream::_M_insert<double>((double)camera->nClip);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," fclip=",7);
  poVar1 = std::ostream::_M_insert<double>((double)camera->fClip);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ]",2);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const CameraInfo& camera) {
  return os << "CameraInfo: " << camera.name << " (id: " << camera.id << ")"
            << " ["
            << " hfov="  << camera.hFov
            << " vfov="  << camera.vFov
            << " nclip=" << camera.nClip
            << " fclip=" << camera.fClip
            << " ]";
}